

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::CoverpointSymbol::CoverpointSymbol
          (CoverpointSymbol *this,Compilation *comp,string_view name,SourceLocation loc)

{
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view name_06;
  string_view name_07;
  string_view name_08;
  string_view name_09;
  string_view name_10;
  string_view name_11;
  LookupLocation lookupLocation;
  LookupLocation lookupLocation_00;
  string_view name_12;
  char *in_RCX;
  size_t in_RDX;
  Compilation *in_RSI;
  Symbol *in_RDI;
  SourceLocation in_R8;
  StructBuilder type_option;
  bool in_stack_0000013f;
  Scope *in_stack_00000140;
  StructBuilder option;
  LanguageVersion lv;
  Type *real_t;
  Type *string_t;
  Type *bit_t;
  Type *int_t;
  size_t in_stack_fffffffffffffda8;
  Type *in_stack_fffffffffffffdb0;
  Compilation *in_stack_fffffffffffffdb8;
  DeclaredType *this_00;
  Scope *in_stack_fffffffffffffdc0;
  bitmask<slang::ast::DeclaredTypeFlags> flags;
  Type *structBuilder;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 uVar1;
  undefined4 in_stack_fffffffffffffdcc;
  VariableLifetime lifetime;
  char *in_stack_fffffffffffffdd0;
  Type *scope;
  Type *pTVar2;
  Type *pTVar3;
  undefined1 in_stack_fffffffffffffe18 [16];
  Scope *in_stack_fffffffffffffe28;
  undefined8 in_stack_fffffffffffffe30;
  bitmask<slang::ast::VariableFlags> local_1ba;
  basic_string_view<char,_std::char_traits<char>_> local_1b8;
  bitmask<slang::ast::VariableFlags> local_1a2;
  basic_string_view<char,_std::char_traits<char>_> local_1a0;
  bitmask<slang::ast::VariableFlags> local_18a;
  basic_string_view<char,_std::char_traits<char>_> local_188;
  undefined8 local_178;
  undefined8 local_170;
  basic_string_view<char,_std::char_traits<char>_> local_148;
  bitmask<slang::ast::VariableFlags> local_132;
  basic_string_view<char,_std::char_traits<char>_> local_130;
  bitmask<slang::ast::VariableFlags> local_11a;
  basic_string_view<char,_std::char_traits<char>_> local_118;
  bitmask<slang::ast::VariableFlags> local_102;
  basic_string_view<char,_std::char_traits<char>_> local_100;
  bitmask<slang::ast::VariableFlags> local_ea;
  basic_string_view<char,_std::char_traits<char>_> local_e8;
  bitmask<slang::ast::VariableFlags> local_d2;
  basic_string_view<char,_std::char_traits<char>_> local_d0;
  bitmask<slang::ast::VariableFlags> local_ba;
  basic_string_view<char,_std::char_traits<char>_> local_b8;
  undefined8 local_a8;
  undefined8 local_a0;
  LanguageVersion local_74;
  Type *local_70;
  Type *local_68;
  Type *local_60;
  Type *local_58;
  bitmask<slang::ast::DeclaredTypeFlags> local_4c;
  underlying_type local_48;
  underlying_type local_44;
  Compilation *local_28;
  
  name_12._M_str = in_RCX;
  name_12._M_len = in_RDX;
  local_28 = in_RSI;
  Symbol::Symbol(in_RDI,Coverpoint,name_12,in_R8);
  Scope::Scope(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
               &in_stack_fffffffffffffdb0->super_Symbol);
  flags.m_bits = (underlying_type)((ulong)in_stack_fffffffffffffdc0 >> 0x20);
  this_00 = (DeclaredType *)&in_RDI[1].originatingSyntax;
  local_48 = (underlying_type)
             ast::operator|((DeclaredTypeFlags)in_stack_fffffffffffffdb0,
                            (DeclaredTypeFlags)(in_stack_fffffffffffffda8 >> 0x20));
  bitmask<slang::ast::DeclaredTypeFlags>::bitmask(&local_4c,CoverageType);
  local_44 = (underlying_type)
             bitmask<slang::ast::DeclaredTypeFlags>::operator|
                       ((bitmask<slang::ast::DeclaredTypeFlags> *)this_00,
                        (bitmask<slang::ast::DeclaredTypeFlags> *)in_stack_fffffffffffffdb0);
  DeclaredType::DeclaredType(this_00,&in_stack_fffffffffffffdb0->super_Symbol,flags);
  std::span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL>::span
            ((span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL> *)0x4109e0);
  std::optional<const_slang::ast::Expression_*>::optional
            ((optional<const_slang::ast::Expression_*> *)0x4109f1);
  *(undefined1 *)&in_RDI[3].location = 0;
  DeclaredType::setOverrideIndex((DeclaredType *)&in_RDI[1].originatingSyntax,1);
  local_58 = Compilation::getIntType(local_28);
  local_60 = Compilation::getBitType(local_28);
  local_68 = Compilation::getStringType(local_28);
  local_70 = Compilation::getRealType(local_28);
  local_74 = Compilation::languageVersion((Compilation *)0x410a6c);
  local_a8 = LookupLocation::min;
  local_a0 = DAT_00e65190;
  lookupLocation._8_8_ = in_stack_fffffffffffffe30;
  lookupLocation.scope = in_stack_fffffffffffffe28;
  StructBuilder::StructBuilder
            (in_stack_fffffffffffffe18._8_8_,in_stack_fffffffffffffe18._0_8_,lookupLocation);
  local_b8 = sv((char *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  structBuilder = local_58;
  bitmask<slang::ast::VariableFlags>::bitmask(&local_ba,None);
  name_00._M_len._4_4_ = in_stack_fffffffffffffdcc;
  name_00._M_len._0_4_ = in_stack_fffffffffffffdc8;
  name_00._M_str = in_stack_fffffffffffffdd0;
  StructBuilder::addField
            ((StructBuilder *)this_00,name_00,in_stack_fffffffffffffdb0,
             (bitmask<slang::ast::VariableFlags>)(underlying_type)((ulong)structBuilder >> 0x30));
  local_d0 = sv((char *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  uVar1 = SUB84(local_58,0);
  lifetime = (VariableLifetime)((ulong)local_58 >> 0x20);
  bitmask<slang::ast::VariableFlags>::bitmask(&local_d2,None);
  name_01._M_len._4_4_ = lifetime;
  name_01._M_len._0_4_ = uVar1;
  name_01._M_str = in_stack_fffffffffffffdd0;
  StructBuilder::addField
            ((StructBuilder *)this_00,name_01,in_stack_fffffffffffffdb0,
             (bitmask<slang::ast::VariableFlags>)(underlying_type)((ulong)structBuilder >> 0x30));
  local_e8 = sv((char *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  scope = local_68;
  bitmask<slang::ast::VariableFlags>::bitmask(&local_ea,None);
  name_02._M_len._4_4_ = lifetime;
  name_02._M_len._0_4_ = uVar1;
  name_02._M_str = (char *)scope;
  StructBuilder::addField
            ((StructBuilder *)this_00,name_02,in_stack_fffffffffffffdb0,
             (bitmask<slang::ast::VariableFlags>)(underlying_type)((ulong)structBuilder >> 0x30));
  local_100 = sv((char *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  pTVar2 = local_58;
  bitmask<slang::ast::VariableFlags>::bitmask(&local_102,None);
  name_03._M_len._4_4_ = lifetime;
  name_03._M_len._0_4_ = uVar1;
  name_03._M_str = (char *)scope;
  StructBuilder::addField
            ((StructBuilder *)this_00,name_03,in_stack_fffffffffffffdb0,
             (bitmask<slang::ast::VariableFlags>)(underlying_type)((ulong)structBuilder >> 0x30));
  local_118 = sv((char *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  pTVar3 = local_58;
  bitmask<slang::ast::VariableFlags>::bitmask(&local_11a,ImmutableCoverageOption);
  name_04._M_len._4_4_ = lifetime;
  name_04._M_len._0_4_ = uVar1;
  name_04._M_str = (char *)scope;
  StructBuilder::addField
            ((StructBuilder *)this_00,name_04,in_stack_fffffffffffffdb0,
             (bitmask<slang::ast::VariableFlags>)(underlying_type)((ulong)structBuilder >> 0x30));
  local_130 = sv((char *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  bitmask<slang::ast::VariableFlags>::bitmask(&local_132,ImmutableCoverageOption);
  name_05._M_len._4_4_ = lifetime;
  name_05._M_len._0_4_ = uVar1;
  name_05._M_str = (char *)scope;
  StructBuilder::addField
            ((StructBuilder *)this_00,name_05,in_stack_fffffffffffffdb0,
             (bitmask<slang::ast::VariableFlags>)(underlying_type)((ulong)structBuilder >> 0x30));
  local_148 = sv((char *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  name_10._M_str = (char *)pTVar3;
  name_10._M_len = (size_t)pTVar2;
  addProperty((Scope *)scope,name_10,lifetime,(StructBuilder *)structBuilder);
  local_178 = LookupLocation::min;
  local_170 = DAT_00e65190;
  lookupLocation_00._8_8_ = in_stack_fffffffffffffe30;
  lookupLocation_00.scope = in_stack_fffffffffffffe28;
  StructBuilder::StructBuilder
            (in_stack_fffffffffffffe18._8_8_,in_stack_fffffffffffffe18._0_8_,lookupLocation_00);
  local_188 = sv((char *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  bitmask<slang::ast::VariableFlags>::bitmask(&local_18a,None);
  name_06._M_len._4_4_ = lifetime;
  name_06._M_len._0_4_ = uVar1;
  name_06._M_str = (char *)scope;
  StructBuilder::addField
            ((StructBuilder *)this_00,name_06,in_stack_fffffffffffffdb0,
             (bitmask<slang::ast::VariableFlags>)(underlying_type)((ulong)structBuilder >> 0x30));
  local_1a0 = sv((char *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  bitmask<slang::ast::VariableFlags>::bitmask(&local_1a2,None);
  name_07._M_len._4_4_ = lifetime;
  name_07._M_len._0_4_ = uVar1;
  name_07._M_str = (char *)scope;
  StructBuilder::addField
            ((StructBuilder *)this_00,name_07,in_stack_fffffffffffffdb0,
             (bitmask<slang::ast::VariableFlags>)(underlying_type)((ulong)structBuilder >> 0x30));
  local_1b8 = sv((char *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  bitmask<slang::ast::VariableFlags>::bitmask(&local_1ba,None);
  name_08._M_len._4_4_ = lifetime;
  name_08._M_len._0_4_ = uVar1;
  name_08._M_str = (char *)scope;
  StructBuilder::addField
            ((StructBuilder *)this_00,name_08,in_stack_fffffffffffffdb0,
             (bitmask<slang::ast::VariableFlags>)(underlying_type)((ulong)structBuilder >> 0x30));
  if (0 < (int)local_74) {
    sv((char *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    in_stack_fffffffffffffdb0 = local_70;
    bitmask<slang::ast::VariableFlags>::bitmask
              ((bitmask<slang::ast::VariableFlags> *)&stack0xfffffffffffffe2e,
               ImmutableCoverageOption);
    name_09._M_len._4_4_ = lifetime;
    name_09._M_len._0_4_ = uVar1;
    name_09._M_str = (char *)scope;
    StructBuilder::addField
              ((StructBuilder *)this_00,name_09,in_stack_fffffffffffffdb0,
               (bitmask<slang::ast::VariableFlags>)(underlying_type)((ulong)structBuilder >> 0x30));
  }
  sv((char *)in_stack_fffffffffffffdb0,(size_t)(in_RDI + 1));
  name_11._M_str = (char *)pTVar3;
  name_11._M_len = (size_t)pTVar2;
  addProperty((Scope *)scope,name_11,lifetime,(StructBuilder *)structBuilder);
  addBuiltInMethods(in_stack_00000140,in_stack_0000013f);
  return;
}

Assistant:

CoverpointSymbol::CoverpointSymbol(Compilation& comp, std::string_view name, SourceLocation loc) :
    Symbol(SymbolKind::Coverpoint, name, loc), Scope(comp, this),
    declaredType(*this, DeclaredTypeFlags::InferImplicit | DeclaredTypeFlags::AutomaticInitializer |
                            DeclaredTypeFlags::CoverageType) {

    // Set the overrideIndex for the type and expression so that they cannot refer to
    // other members of the parent covergroup. This allows coverpoints named the same
    // as formal arguments to not interfere with lookup.
    declaredType.setOverrideIndex(SymbolIndex(1));

    auto& int_t = comp.getIntType();
    auto& bit_t = comp.getBitType();
    auto& string_t = comp.getStringType();
    auto& real_t = comp.getRealType();
    auto lv = comp.languageVersion();

    StructBuilder option(*this, LookupLocation::min);
    option.addField("weight"sv, int_t);
    option.addField("goal"sv, int_t);
    option.addField("comment"sv, string_t);
    option.addField("at_least"sv, int_t);
    option.addField("auto_bin_max"sv, int_t, VariableFlags::ImmutableCoverageOption);
    option.addField("detect_overlap"sv, bit_t, VariableFlags::ImmutableCoverageOption);
    addProperty(*this, "option"sv, VariableLifetime::Automatic, option);

    StructBuilder type_option(*this, LookupLocation::min);
    type_option.addField("weight"sv, int_t);
    type_option.addField("goal"sv, int_t);
    type_option.addField("comment"sv, string_t);
    if (lv >= LanguageVersion::v1800_2023)
        type_option.addField("real_interval"sv, real_t, VariableFlags::ImmutableCoverageOption);
    addProperty(*this, "type_option"sv, VariableLifetime::Static, type_option);

    addBuiltInMethods(*this, false);
}